

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexSeparableFilter::applyAcrossEdge
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f,int eid)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  EdgeId eid_00;
  int iVar4;
  FaceInfo *in_RCX;
  PtexSeparableKernel *in_RSI;
  PtexSeparableKernel *in_RDI;
  int in_R8D;
  bool primary_1;
  int neid;
  bool primary;
  bool afIsSubface;
  bool fIsSubface;
  int rot;
  FaceInfo *af;
  int aeid;
  int afid;
  FaceInfo *in_stack_000000b8;
  int in_stack_000000c4;
  PtexSeparableKernel *in_stack_000000c8;
  PtexSeparableFilter *in_stack_000000d0;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc1;
  FaceInfo *local_38;
  int local_28;
  
  local_28 = FaceInfo::adjface(in_RCX,in_R8D);
  eid_00 = FaceInfo::adjedge(in_RCX,in_R8D);
  local_38 = (FaceInfo *)(**(code **)(**(long **)&in_RDI->v + 0x80))(*(long **)&in_RDI->v,local_28);
  iVar4 = (in_R8D - eid_00) + 2;
  bVar1 = FaceInfo::isSubface(in_RCX);
  bVar2 = FaceInfo::isSubface(local_38);
  if ((bVar1 & 1) != bVar2) {
    if ((bool)bVar2) {
      bVar3 = PtexSeparableKernel::adjustMainToSubface
                        ((PtexSeparableKernel *)
                         CONCAT44(iVar4,CONCAT13(bVar1,CONCAT12(bVar2,CONCAT11(
                                                  in_stack_ffffffffffffffc1,
                                                  in_stack_ffffffffffffffc0)))),
                         in_stack_ffffffffffffffbc);
      if (!bVar3) {
        iVar4 = (int)(eid_00 + e_left) % 4;
        local_28 = FaceInfo::adjface(local_38,iVar4);
        FaceInfo::adjedge(local_38,iVar4);
        local_38 = (FaceInfo *)
                   (**(code **)(**(long **)&in_RDI->v + 0x80))(*(long **)&in_RDI->v,local_28);
      }
    }
    else {
      FaceInfo::adjface(local_38,eid_00);
      PtexSeparableKernel::adjustSubfaceToMain
                ((PtexSeparableKernel *)
                 CONCAT44(iVar4,CONCAT13(bVar1,CONCAT12(bVar2,CONCAT11(in_stack_ffffffffffffffc1,
                                                                       in_stack_ffffffffffffffc0))))
                 ,in_stack_ffffffffffffffbc);
    }
  }
  PtexSeparableKernel::rotate(in_RDI,in_stack_ffffffffffffffac);
  if ((bVar2 & 1) == 0) {
    apply((PtexSeparableFilter *)in_RDI,in_RSI,local_28,local_38);
  }
  else {
    splitAndApply(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000b8);
  }
  return;
}

Assistant:

void PtexSeparableFilter::applyAcrossEdge(PtexSeparableKernel& k,
                                          int faceid, const Ptex::FaceInfo& f, int eid)
{
    int afid = f.adjface(eid), aeid = f.adjedge(eid);
    const Ptex::FaceInfo* af = &_tx->getFaceInfo(afid);
    int rot = eid - aeid + 2;

    // adjust uv coord and res for face/subface boundary
    bool fIsSubface = f.isSubface(), afIsSubface = af->isSubface();
    if (fIsSubface != afIsSubface) {
        if (afIsSubface) {
            // main face to subface transition
            // adjust res and offset uv coord for primary subface
            bool primary = k.adjustMainToSubface(eid);
            if (!primary) {
                // advance ajacent face and edge id to secondary subface
                int neid = (aeid + 3) % 4;
                afid = af->adjface(neid);
                aeid = af->adjedge(neid);
                af = &_tx->getFaceInfo(afid);
                rot += neid - aeid + 2;
            }
        }
        else {
            // subface to main face transition
            // Note: the transform depends on which subface the kernel is
            // coming from.  The "primary" subface is the one the main
            // face is pointing at.  The secondary subface adjustment
            // happens to be the same as for the primary subface for the
            // next edge, so the cases can be combined.
            bool primary = (af->adjface(aeid) == faceid);
            k.adjustSubfaceToMain(eid - primary);
        }
    }

    // rotate and apply (resplit if going to a subface)
    k.rotate(rot);
    if (afIsSubface) splitAndApply(k, afid, *af);
    else apply(k, afid, *af);
}